

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

ssh_key * opensshcert_ca_pub_key(opensshcert_key *ck,ptrlen sig,ptrlen *algname)

{
  ptrlen blob;
  ssh_keyalg *self;
  ptrlen pub;
  ptrlen pVar1;
  ssh_keyalg *ca_alg;
  size_t local_58;
  void *local_50;
  ptrlen alg_source;
  ptrlen ca_keyblob;
  ptrlen *algname_local;
  opensshcert_key *ck_local;
  ptrlen sig_local;
  
  alg_source.ptr = (void *)sig.len;
  local_50 = sig.ptr;
  pub = ptrlen_from_strbuf(ck->signature_key);
  if (local_50 == (void *)0x0) {
    alg_source.len = (size_t)pub.ptr;
    local_50 = (void *)alg_source.len;
    ca_keyblob.ptr = (void *)pub.len;
    alg_source.ptr = ca_keyblob.ptr;
  }
  if (algname != (ptrlen *)0x0) {
    pVar1.len = (size_t)alg_source.ptr;
    pVar1.ptr = local_50;
    pVar1 = pubkey_blob_to_alg_name(pVar1);
    ca_alg = (ssh_keyalg *)pVar1.ptr;
    algname->ptr = ca_alg;
    local_58 = pVar1.len;
    algname->len = local_58;
  }
  blob.len = (size_t)alg_source.ptr;
  blob.ptr = local_50;
  self = pubkey_blob_to_alg(blob);
  if (self == (ssh_keyalg *)0x0) {
    sig_local.len = 0;
  }
  else {
    sig_local.len = (size_t)ssh_key_new_pub(self,pub);
  }
  return (ssh_key *)sig_local.len;
}

Assistant:

static ssh_key *opensshcert_ca_pub_key(
    opensshcert_key *ck, ptrlen sig, ptrlen *algname)
{
    ptrlen ca_keyblob = ptrlen_from_strbuf(ck->signature_key);

    ptrlen alg_source = sig.ptr ? sig : ca_keyblob;
    if (algname)
        *algname = pubkey_blob_to_alg_name(alg_source);

    const ssh_keyalg *ca_alg = pubkey_blob_to_alg(alg_source);
    if (!ca_alg)
        return NULL;  /* don't even recognise the certifying key type */

    return ssh_key_new_pub(ca_alg, ca_keyblob);
}